

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NeuralNetworkClassifier::InternalSwap
          (NeuralNetworkClassifier *this,NeuralNetworkClassifier *other)

{
  int iVar1;
  uint32 uVar2;
  string *psVar3;
  NetworkUpdateParameters *pNVar4;
  ClassLabelsUnion CVar5;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->layers_).super_RepeatedPtrFieldBase,
             &(other->layers_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->preprocessing_).super_RepeatedPtrFieldBase,
             &(other->preprocessing_).super_RepeatedPtrFieldBase);
  psVar3 = (this->labelprobabilitylayername_).ptr_;
  (this->labelprobabilitylayername_).ptr_ = (other->labelprobabilitylayername_).ptr_;
  (other->labelprobabilitylayername_).ptr_ = psVar3;
  pNVar4 = this->updateparams_;
  this->updateparams_ = other->updateparams_;
  other->updateparams_ = pNVar4;
  iVar1 = this->arrayinputshapemapping_;
  this->arrayinputshapemapping_ = other->arrayinputshapemapping_;
  other->arrayinputshapemapping_ = iVar1;
  iVar1 = this->imageinputshapemapping_;
  this->imageinputshapemapping_ = other->imageinputshapemapping_;
  other->imageinputshapemapping_ = iVar1;
  CVar5 = this->ClassLabels_;
  this->ClassLabels_ = other->ClassLabels_;
  other->ClassLabels_ = CVar5;
  uVar2 = this->_oneof_case_[0];
  this->_oneof_case_[0] = other->_oneof_case_[0];
  other->_oneof_case_[0] = uVar2;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void NeuralNetworkClassifier::InternalSwap(NeuralNetworkClassifier* other) {
  layers_.InternalSwap(&other->layers_);
  preprocessing_.InternalSwap(&other->preprocessing_);
  labelprobabilitylayername_.Swap(&other->labelprobabilitylayername_);
  std::swap(updateparams_, other->updateparams_);
  std::swap(arrayinputshapemapping_, other->arrayinputshapemapping_);
  std::swap(imageinputshapemapping_, other->imageinputshapemapping_);
  std::swap(ClassLabels_, other->ClassLabels_);
  std::swap(_oneof_case_[0], other->_oneof_case_[0]);
  std::swap(_cached_size_, other->_cached_size_);
}